

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.hpp
# Opt level: O0

mutable_buffer asio::operator+(mutable_buffer *b,size_t n)

{
  size_t sVar1;
  void *pvVar2;
  ulong in_RSI;
  mutable_buffer *in_RDI;
  size_t new_size;
  char *new_data;
  size_t offset;
  size_t local_48;
  mutable_buffer local_10;
  
  sVar1 = mutable_buffer::size(in_RDI);
  local_48 = in_RSI;
  if (sVar1 <= in_RSI) {
    local_48 = mutable_buffer::size(in_RDI);
  }
  pvVar2 = mutable_buffer::data(in_RDI);
  sVar1 = mutable_buffer::size(in_RDI);
  mutable_buffer::mutable_buffer(&local_10,(void *)((long)pvVar2 + local_48),sVar1 - local_48);
  return local_10;
}

Assistant:

inline mutable_buffer operator+(const mutable_buffer& b,
    std::size_t n) ASIO_NOEXCEPT
{
  std::size_t offset = n < b.size() ? n : b.size();
  char* new_data = static_cast<char*>(b.data()) + offset;
  std::size_t new_size = b.size() - offset;
  return mutable_buffer(new_data, new_size
#if defined(ASIO_ENABLE_BUFFER_DEBUGGING)
      , b.get_debug_check()
#endif // ASIO_ENABLE_BUFFER_DEBUGGING
      );
}